

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O0

Vec3 __thiscall rr::advblend::setLum(advblend *this,Vec3 *cbase,Vec3 *clum)

{
  float fVar1;
  undefined8 extraout_XMM0_Qa;
  float fVar2;
  Vector<float,_3> VVar3;
  Vec3 VVar4;
  float local_c0;
  float local_b8;
  Vector<float,_3> local_94;
  Vector<float,_3> local_88;
  Vector<float,_3> local_7c;
  Vector<float,_3> local_70;
  Vector<float,_3> local_64;
  Vector<float,_3> local_58;
  float local_4c;
  float local_48;
  float maxC;
  float minC;
  undefined1 local_38 [8];
  Vec3 color;
  float ldiff;
  float llum;
  float lbase;
  Vec3 *clum_local;
  Vec3 *cbase_local;
  undefined8 uVar5;
  float fVar6;
  
  fVar1 = luminosity(cbase);
  color.m_data[2] = luminosity(clum);
  color.m_data[1] = color.m_data[2] - fVar1;
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&maxC,color.m_data[1]);
  tcu::operator+((tcu *)local_38,cbase,(Vector<float,_3> *)&maxC);
  local_48 = minComp((Vec3 *)local_38);
  local_4c = maxComp((Vec3 *)local_38);
  fVar1 = color.m_data[2];
  if (0.0 <= local_48) {
    fVar2 = 1.0;
    if (local_4c <= 1.0) {
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)this,(Vector<float,_3> *)local_38);
      VVar3.m_data[2] = fVar2;
      VVar3.m_data[0] = (float)(int)extraout_XMM0_Qa;
      VVar3.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
    }
    else {
      tcu::operator-((tcu *)&local_94,(Vector<float,_3> *)local_38,color.m_data[2]);
      tcu::operator*((tcu *)&local_88,&local_94,1.0 - color.m_data[2]);
      if ((color.m_data[2] != local_4c) || (NAN(color.m_data[2]) || NAN(local_4c))) {
        local_c0 = local_4c - color.m_data[2];
      }
      else {
        local_c0 = 1.0;
      }
      tcu::operator/((tcu *)&local_7c,&local_88,local_c0);
      VVar3 = tcu::operator+((tcu *)this,fVar1,&local_7c);
    }
  }
  else {
    tcu::operator-((tcu *)&local_70,(Vector<float,_3> *)local_38,color.m_data[2]);
    tcu::operator*((tcu *)&local_64,&local_70,color.m_data[2]);
    if ((color.m_data[2] != local_48) || (NAN(color.m_data[2]) || NAN(local_48))) {
      local_b8 = color.m_data[2] - local_48;
    }
    else {
      local_b8 = 1.0;
    }
    tcu::operator/((tcu *)&local_58,&local_64,local_b8);
    VVar3 = tcu::operator+((tcu *)this,fVar1,&local_58);
  }
  VVar4.m_data[0] = VVar3.m_data[0];
  uVar5._4_4_ = VVar3.m_data[1];
  register0x00001240 = VVar3.m_data[2];
  return (Vec3)VVar4.m_data;
}

Assistant:

Vec3 setLum (const Vec3& cbase, const Vec3& clum)
{
	const float		lbase	= luminosity(cbase);
	const float		llum	= luminosity(clum);
	const float		ldiff	= llum - lbase;
	const Vec3		color	= cbase + Vec3(ldiff);
	const float		minC	= minComp(color);
	const float		maxC	= maxComp(color);

	if (minC < 0.0f)
		return llum + ((color-llum)*llum / (llum != minC ? (llum-minC) : 1.0f));
	else if (maxC > 1.0f)
		return llum + ((color-llum)*(1.0f-llum) / (llum != maxC ? (maxC-llum) : 1.0f));
	else
		return color;
}